

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertions.cpp
# Opt level: O2

void cgreen::assert_that_
               (char *file,int line,char *actual_string,string *actual,Constraint *constraint)

{
  _Bool _Var1;
  
  _Var1 = is_string_comparing(constraint);
  if (_Var1) {
    actual = *(string **)actual;
  }
  assert_core_(file,line,actual_string,(intptr_t)actual,constraint);
  return;
}

Assistant:

void assert_that_(const char *file, int line, const char *actual_string,
                      const std::string *actual, Constraint* constraint) {

        // if they are using a string constraint, they are almost certainly meaning to do a deep comparison
        if (is_string_comparing(constraint)) {
            assert_core_(file, line, actual_string, (intptr_t) (actual->c_str()),
                         constraint);
            return;
        }

        assert_core_(file, line, actual_string, (intptr_t) actual, constraint);
    }